

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_x86.c
# Opt level: O2

int funchook_fix_code(funchook_t *funchook,funchook_entry_t *entry,ip_displacement_t *disp)

{
  uint8_t *src;
  void *pvVar1;
  insn_t *piVar2;
  int iVar3;
  uint8_t *puVar4;
  
  src = (uint8_t *)entry->target_func;
  puVar4 = (uint8_t *)((long)entry->hook_func + (-5 - (long)src));
  if ((uint8_t *)(long)(int)puVar4 == puVar4) {
    funchook_write_jump32(funchook,src,(uint8_t *)entry->hook_func,entry->new_code);
    entry->transit[0] = '\0';
  }
  else {
    funchook_write_jump32(funchook,src,entry->transit,entry->new_code);
    pvVar1 = entry->hook_func;
    entry->transit[0] = 0xff;
    entry->transit[1] = '%';
    entry->transit[2] = '\0';
    entry->transit[3] = '\0';
    entry->transit[4] = '\0';
    entry->transit[5] = '\0';
    *(void **)(entry->transit + 6) = pvVar1;
    funchook_log(funchook,"  Write jump64 0x%016lx -> 0x%016lx\n",entry->transit);
  }
  iVar3 = (int)entry->trampoline;
  *(int *)(entry->trampoline + disp->disp[0].pos_offset) =
       *(int *)&disp->disp[0].dst_addr - ((int)disp->disp[0].src_addr_offset + iVar3);
  piVar2 = disp->disp[1].dst_addr;
  if (piVar2 != (insn_t *)0x0) {
    *(int *)(entry->trampoline + disp->disp[1].pos_offset) =
         (int)piVar2 - ((int)disp->disp[1].src_addr_offset + iVar3);
  }
  return 0;
}

Assistant:

int funchook_fix_code(funchook_t *funchook, funchook_entry_t *entry, const ip_displacement_t *disp)
{
    insn_t *src_addr;
    uint32_t *offset_addr;

#ifdef CPU_X86_64
    if (funchook_jump32_avail(entry->target_func, entry->hook_func)) {
        funchook_write_jump32(funchook, entry->target_func, entry->hook_func, entry->new_code);
        entry->transit[0] = 0;
    } else {
        funchook_write_jump32(funchook, entry->target_func, entry->transit, entry->new_code);
        funchook_write_jump64(funchook, entry->transit, entry->hook_func);
    }
#else
    funchook_write_jump32(funchook, entry->target_func, entry->hook_func, entry->new_code);
#endif
    /* fix rip-relative offsets */
    src_addr = entry->trampoline + disp->disp[0].src_addr_offset;
    offset_addr = (uint32_t*)(entry->trampoline + disp->disp[0].pos_offset);
    *offset_addr = (uint32_t)(disp->disp[0].dst_addr - src_addr);
    if (disp->disp[1].dst_addr != 0) {
        src_addr = entry->trampoline + disp->disp[1].src_addr_offset;
        offset_addr = (uint32_t*)(entry->trampoline + disp->disp[1].pos_offset);
        *offset_addr = (uint32_t)(disp->disp[1].dst_addr - src_addr);
    }
    return 0;
}